

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::BaseTimeCoordinator::processDependencyUpdateMessage
          (BaseTimeCoordinator *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  bool added;
  int8_t version;
  undefined4 in_stack_ffffffffffffffb8;
  GlobalFederateId in_stack_ffffffffffffffc4;
  BaseType in_stack_ffffffffffffffc8;
  BaseType in_stack_ffffffffffffffcc;
  GlobalFederateId in_stack_ffffffffffffffd4;
  byte local_11;
  
  local_11 = 0;
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 == cmd_add_dependency) {
    local_11 = (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,(in_RSI->source_id).gid);
    local_11 = local_11 & 1;
  }
  else if (aVar2 == cmd_remove_dependency) {
    (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,(in_RSI->source_id).gid);
  }
  else if (aVar2 == cmd_add_dependent) {
    (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,(in_RSI->source_id).gid);
  }
  else if (aVar2 == cmd_remove_dependent) {
    (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,(in_RSI->source_id).gid);
  }
  else if (aVar2 == cmd_add_interdependency) {
    local_11 = (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,(in_RSI->source_id).gid);
    local_11 = local_11 & 1;
    in_stack_ffffffffffffffd4.gid = (in_RSI->source_id).gid;
    (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,in_stack_ffffffffffffffd4.gid);
  }
  else if (aVar2 == cmd_remove_interdependency) {
    (**(code **)(*(long *)in_RDI + 0x30))(in_RDI,(in_RSI->source_id).gid);
    in_stack_ffffffffffffffcc = (in_RSI->source_id).gid;
    (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,in_stack_ffffffffffffffcc);
  }
  else if (aVar2 == cmd_timing_info) {
    TimeDependencies::updateTime
              ((TimeDependencies *)CONCAT44(0x136,in_stack_ffffffffffffffb8),in_RDI);
  }
  version = (int8_t)((ulong)in_RDI >> 0x38);
  if (local_11 != 0) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RSI,child_flag);
    if (bVar1) {
      in_stack_ffffffffffffffc8 = (in_RSI->source_id).gid;
      setAsChild((BaseTimeCoordinator *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffd4);
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RSI,parent_flag);
    if (bVar1) {
      in_stack_ffffffffffffffc4.gid = (in_RSI->source_id).gid;
      setAsParent((BaseTimeCoordinator *)
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  in_stack_ffffffffffffffd4);
    }
    if (in_RSI->counter != 0) {
      setVersion((BaseTimeCoordinator *)CONCAT44(aVar2,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffc4,version);
    }
  }
  return;
}

Assistant:

void BaseTimeCoordinator::processDependencyUpdateMessage(const ActionMessage& cmd)
{
    bool added{false};
    switch (cmd.action()) {
        case CMD_ADD_DEPENDENCY:
            added = addDependency(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENCY:
            removeDependency(cmd.source_id);
            break;
        case CMD_ADD_DEPENDENT:
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENT:
            removeDependent(cmd.source_id);
            break;
        case CMD_ADD_INTERDEPENDENCY:
            added = addDependency(cmd.source_id);
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_INTERDEPENDENCY:
            removeDependency(cmd.source_id);
            removeDependent(cmd.source_id);
            break;
        case CMD_TIMING_INFO:
            dependencies.updateTime(cmd);
            break;
        default:
            break;
    }
    if (added) {
        if (checkActionFlag(cmd, child_flag)) {
            setAsChild(cmd.source_id);
        }
        if (checkActionFlag(cmd, parent_flag)) {
            setAsParent(cmd.source_id);
        }
        if (cmd.counter > 0) {
            setVersion(cmd.source_id, cmd.counter);
        }
    }
}